

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringview.h
# Opt level: O2

bool __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::isNull
          (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *this)

{
  if (((this->a).a.m_data == (char *)0x0) && ((((this->a).b)->d).ptr == (char16_t *)0x0)) {
    return (this->b).m_data == (char *)0x0;
  }
  return false;
}

Assistant:

constexpr bool isNull() const noexcept { return !data(); }